

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

void run_container_xor(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  uint16_t start;
  uint16_t start_00;
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar2 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar2) {
    run_container_grow(dst,iVar2,false);
  }
  dst->n_runs = 0;
  iVar2 = src_1->n_runs;
  iVar4 = 0;
  if (iVar2 < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    iVar4 = 0;
    if (0 < src_2->n_runs) {
      iVar4 = 0;
      iVar1 = 0;
      do {
        start = src_1->runs[iVar4].value;
        start_00 = src_2->runs[iVar1].value;
        if (start_00 < start) {
          run_container_smart_append_exclusive(dst,start_00,src_2->runs[iVar1].length);
          iVar1 = iVar1 + 1;
        }
        else {
          run_container_smart_append_exclusive(dst,start,src_1->runs[iVar4].length);
          iVar4 = iVar4 + 1;
        }
        iVar2 = src_1->n_runs;
      } while ((iVar4 < iVar2) && (iVar1 < src_2->n_runs));
    }
  }
  if (iVar4 < iVar2) {
    lVar3 = (long)iVar4;
    do {
      run_container_smart_append_exclusive(dst,src_1->runs[lVar3].value,src_1->runs[lVar3].length);
      lVar3 = lVar3 + 1;
    } while (lVar3 < src_1->n_runs);
  }
  if (iVar1 < src_2->n_runs) {
    lVar3 = (long)iVar1;
    do {
      run_container_smart_append_exclusive(dst,src_2->runs[lVar3].value,src_2->runs[lVar3].length);
      lVar3 = lVar3 + 1;
    } while (lVar3 < src_2->n_runs);
  }
  return;
}

Assistant:

void run_container_xor(const run_container_t *src_1,
                       const run_container_t *src_2, run_container_t *dst) {
    // don't bother to convert xor with full range into negation
    // since negation is implemented similarly

    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);

    int32_t pos1 = 0;
    int32_t pos2 = 0;
    dst->n_runs = 0;

    while ((pos1 < src_1->n_runs) && (pos2 < src_2->n_runs)) {
        if (src_1->runs[pos1].value <= src_2->runs[pos2].value) {
            run_container_smart_append_exclusive(dst, src_1->runs[pos1].value,
                                                 src_1->runs[pos1].length);
            pos1++;
        } else {
            run_container_smart_append_exclusive(dst, src_2->runs[pos2].value,
                                                 src_2->runs[pos2].length);
            pos2++;
        }
    }
    while (pos1 < src_1->n_runs) {
        run_container_smart_append_exclusive(dst, src_1->runs[pos1].value,
                                             src_1->runs[pos1].length);
        pos1++;
    }

    while (pos2 < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[pos2].value,
                                             src_2->runs[pos2].length);
        pos2++;
    }
}